

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall
enact::CallExpr::CallExpr
          (CallExpr *this,unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *callee,
          vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
          *args,Token *paren)

{
  Token *paren_local;
  vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
  *args_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *callee_local;
  CallExpr *this_local;
  
  Expr::Expr(&this->super_Expr);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__CallExpr_0016a690;
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr(&this->callee,callee);
  std::
  vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
  ::vector(&this->args,args);
  Token::Token(&this->paren,paren);
  return;
}

Assistant:

CallExpr(std::unique_ptr<Expr> callee, std::vector<std::unique_ptr<Expr>> args, Token paren) :
                callee{std::move(callee)},
                args{std::move(args)},
                paren{std::move(paren)} {}